

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool string_find_replace(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_value_t value;
  gravity_fiber_t *fiber;
  char *s_00;
  gravity_value_t gVar1;
  char *s;
  size_t len;
  gravity_string_t *to;
  gravity_string_t *from;
  gravity_string_t *string;
  undefined8 local_1030;
  char local_1028 [8];
  char _buffer [4096];
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  _buffer._4088_4_ = rindex;
  _buffer._4094_2_ = nargs;
  if (((nargs == 3) && (args[1].isa == gravity_class_string)) &&
     (args[2].isa == gravity_class_string)) {
    from = (gravity_string_t *)(args->field_1).p;
    to = (gravity_string_t *)args[1].field_1.p;
    len = (size_t)args[2].field_1.p;
    s = (char *)0x0;
    s_00 = string_replace((char *)((gravity_object_t *)from)->objclass,
                          (char *)((gravity_object_t *)to)->objclass,
                          (char *)((gravity_object_t *)len)->objclass,(size_t *)&s);
    if ((s_00 == (char *)0x0) || (s == (char *)0x0)) {
      gVar1.field_1.n = 0;
      gVar1.isa = gravity_class_null;
      gravity_vm_setslot(vm,gVar1,_buffer._4088_4_);
      vm_local._7_1_ = true;
    }
    else {
      gVar1 = gravity_string_to_value(vm,s_00,(uint32_t)s);
      gravity_vm_setslot(vm,gVar1,_buffer._4088_4_);
      vm_local._7_1_ = true;
    }
  }
  else {
    snprintf(local_1028,0x1000,"String.replace() expects 2 string arguments.");
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1028);
    string = (gravity_string_t *)gravity_class_null;
    local_1030 = 0;
    value.field_1.n = 0;
    value.isa = gravity_class_null;
    gravity_vm_setslot(vm,value,_buffer._4088_4_);
    vm_local._7_1_ = false;
  }
  return vm_local._7_1_;
}

Assistant:

static bool string_find_replace (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    // sanity check
    if ((nargs != 3) || (!VALUE_ISA_STRING(GET_VALUE(1))) || (!VALUE_ISA_STRING(GET_VALUE(2)))) RETURN_ERROR("String.replace() expects 2 string arguments.");
    
    // setup arguments
    gravity_string_t *string = VALUE_AS_STRING(GET_VALUE(0));
    gravity_string_t *from = VALUE_AS_STRING(GET_VALUE(1));
    gravity_string_t *to = VALUE_AS_STRING(GET_VALUE(2));
    size_t len = 0;
    
    // perform search and replace
    char *s = string_replace(string->s, from->s, to->s, &len);
    
    // return result
    if (s && len) RETURN_VALUE(VALUE_FROM_STRING(vm, s, (uint32_t)len), rindex);
    RETURN_VALUE(VALUE_FROM_NULL, rindex);
}